

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Own<const_kj::ReadableFile> __thiscall
kj::ReadableDirectory::openFile(ReadableDirectory *this,PathPtr path)

{
  Fault FVar1;
  Clock *clock;
  ReadableFile *extraout_RDX;
  Own<const_kj::ReadableFile> OVar2;
  Fault f;
  ReadableFile *pRStack_50;
  OwnOwn<const_kj::ReadableFile> file;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)path.parts.size_;
  (**(code **)(((path.parts.ptr)->content).ptr + 0x50))(&f);
  FVar1 = f;
  file.value.disposer = (Disposer *)f.exception;
  file.value.ptr = pRStack_50;
  Own<const_kj::ReadableFile>::dispose((Own<const_kj::ReadableFile> *)&f);
  if (pRStack_50 == (ReadableFile *)0x0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[18],kj::PathPtr&>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x227,FAILED,(char *)0x0,"\"no such directory\", path",
               (char (*) [18])"no such directory",&path_local);
    _::Debug::Fault::~Fault(&f);
    clock = nullClock();
    newInMemoryFile((kj *)&f,clock);
    (this->super_FsNode)._vptr_FsNode = (_func_int **)f.exception;
    this[1].super_FsNode._vptr_FsNode = (_func_int **)0x0;
    Own<kj::File>::dispose((Own<kj::File> *)&f);
  }
  else {
    (this->super_FsNode)._vptr_FsNode = (_func_int **)FVar1.exception;
    this[1].super_FsNode._vptr_FsNode = (_func_int **)pRStack_50;
    file.value.ptr = (ReadableFile *)0x0;
  }
  Own<const_kj::ReadableFile>::dispose(&file.value);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<const ReadableFile> ReadableDirectory::openFile(PathPtr path) const {
  KJ_IF_MAYBE(file, tryOpenFile(path)) {
    return kj::mv(*file);
  } else {
    KJ_FAIL_REQUIRE("no such directory", path) { break; }